

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

GArray * g_array_set_size(GArray *farray,guint length)

{
  GRealArray *array;
  guint length_local;
  GArray *farray_local;
  
  if (farray->len < length) {
    g_array_maybe_expand((GRealArray *)farray,length - farray->len);
    if ((*(byte *)((long)&farray[1].data + 4) >> 1 & 1) != 0) {
      memset(farray->data + *(int *)&farray[1].data * farray->len,0,
             (ulong)(*(int *)&farray[1].data * (length - farray->len)));
    }
  }
  else if (length < farray->len) {
    g_array_remove_range(farray,length,farray->len - length);
  }
  farray->len = length;
  if (((ulong)farray[1].data & 0x100000000) != 0) {
    memset(farray->data + *(int *)&farray[1].data * farray->len,0,(ulong)*(uint *)&farray[1].data);
  }
  return farray;
}

Assistant:

GArray* g_array_set_size (GArray *farray,
        guint   length)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);

    if (length > array->len)
    {
        g_array_maybe_expand (array, length - array->len);

        if (array->clear)
            g_array_elt_zero (array, array->len, length - array->len);
    }
    else if (length < array->len)
        g_array_remove_range (farray, length, array->len - length);

    array->len = length;

    g_array_zero_terminate (array);

    return farray;
}